

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosString.cpp
# Opt level: O2

Params * adios2::helper::BuildParametersMap
                   (Params *__return_storage_ptr__,string *input,char delimKeyValue,char delimItem)

{
  _Rb_tree_header *p_Var1;
  istream *piVar2;
  long lVar3;
  size_type sVar4;
  mapped_type *pmVar5;
  string *psVar6;
  allocator local_309;
  Params *local_308;
  uint local_2fc;
  allocator local_2f6;
  allocator local_2f5;
  int local_2f4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  string local_2b0;
  string parameter;
  string value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  string key;
  istringstream inputSS;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::istringstream::istringstream((istringstream *)&inputSS,(string *)input,_S_in);
  parameter._M_dataplus._M_p = (pointer)&parameter.field_2;
  parameter._M_string_length = 0;
  parameter.field_2._M_local_buf[0] = '\0';
  local_2f4 = (int)delimItem;
  local_2fc = (uint)delimKeyValue;
  local_308 = __return_storage_ptr__;
  while( true ) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&inputSS,(string *)&parameter,(char)local_2f4);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
    lVar3 = std::__cxx11::string::find((char)&parameter,(ulong)local_2fc);
    if (lVar3 == -1) {
      std::__cxx11::string::string((string *)&key,"Helper",(allocator *)&local_210);
      std::__cxx11::string::string((string *)&value,"adiosString",(allocator *)&local_230);
      std::__cxx11::string::string((string *)&local_2b0,"BuildParametersMap",&local_309);
      std::operator+(&local_2f0,"wrong format for IO parameter ",&parameter);
      std::operator+(&local_250,&local_2f0,", format must be key");
      std::operator+(&local_2d0,&local_250,(char)local_2fc);
      std::operator+(&local_1f0,&local_2d0,"value for each entry");
      Throw<std::invalid_argument>(&key,&value,&local_2b0,&local_1f0,-1);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&local_2f0);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::__cxx11::string::~string((string *)&value);
      std::__cxx11::string::~string((string *)&key);
    }
    psVar6 = &parameter;
    std::__cxx11::string::substr((ulong)&key,(ulong)psVar6);
    BuildParametersMap::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)&key,psVar6);
    psVar6 = &parameter;
    std::__cxx11::string::substr((ulong)&value,(ulong)psVar6);
    __return_storage_ptr__ = local_308;
    BuildParametersMap::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)&value,psVar6);
    if (value._M_string_length == 0) {
      std::__cxx11::string::string((string *)&local_2b0,"Helper",&local_309);
      std::__cxx11::string::string((string *)&local_1f0,"adiosString",&local_2f5);
      std::__cxx11::string::string((string *)&local_2d0,"BuildParametersMap",&local_2f6);
      std::operator+(&local_230,"empty value in IO parameter ",&parameter);
      std::operator+(&local_210,&local_230,", format must be key");
      std::operator+(&local_2f0,&local_210,(char)local_2fc);
      std::operator+(&local_250,&local_2f0,"value");
      Throw<std::invalid_argument>(&local_2b0,&local_1f0,&local_2d0,&local_250,-1);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&local_2f0);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_2b0);
    }
    sVar4 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::count(__return_storage_ptr__,&key);
    if (sVar4 == 1) {
      std::__cxx11::string::string((string *)&local_2b0,"Helper",(allocator *)&local_210);
      std::__cxx11::string::string((string *)&local_1f0,"adiosString",(allocator *)&local_230);
      std::__cxx11::string::string((string *)&local_2d0,"BuildParametersMap",&local_309);
      std::operator+(&local_2f0,"key ",&key);
      std::operator+(&local_250,&local_2f0," appears multiple times in the parameters string");
      Throw<std::invalid_argument>(&local_2b0,&local_1f0,&local_2d0,&local_250,-1);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&local_2f0);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_2b0);
    }
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](__return_storage_ptr__,&key);
    std::__cxx11::string::_M_assign((string *)pmVar5);
    std::__cxx11::string::~string((string *)&value);
    std::__cxx11::string::~string((string *)&key);
  }
  std::__cxx11::string::~string((string *)&parameter);
  std::__cxx11::istringstream::~istringstream((istringstream *)&inputSS);
  return __return_storage_ptr__;
}

Assistant:

Params BuildParametersMap(const std::string &input, const char delimKeyValue, const char delimItem)
{
    auto lf_Trim = [](std::string &input) {
        input.erase(0, input.find_first_not_of(" \n\r\t")); // prefixing spaces
        input.erase(input.find_last_not_of(" \n\r\t") + 1); // suffixing spaces
    };

    Params parametersOutput;

    std::istringstream inputSS(input);
    std::string parameter;
    while (std::getline(inputSS, parameter, delimItem))
    {
        const size_t position = parameter.find(delimKeyValue);
        if (position == parameter.npos)
        {
            helper::Throw<std::invalid_argument>("Helper", "adiosString", "BuildParametersMap",
                                                 "wrong format for IO parameter " + parameter +
                                                     ", format must be key" + delimKeyValue +
                                                     "value for each entry");
        }

        std::string key = parameter.substr(0, position);
        lf_Trim(key);
        std::string value = parameter.substr(position + 1);
        lf_Trim(value);
        if (value.length() == 0)
        {
            helper::Throw<std::invalid_argument>("Helper", "adiosString", "BuildParametersMap",
                                                 "empty value in IO parameter " + parameter +
                                                     ", format must be key" + delimKeyValue +
                                                     "value");
        }
        if (parametersOutput.count(key) == 1)
        {
            helper::Throw<std::invalid_argument>(
                "Helper", "adiosString", "BuildParametersMap",
                "key " + key + " appears multiple times in the parameters string");
        }

        parametersOutput[key] = value;
    }

    return parametersOutput;
}